

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_10c881::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  PixelType PVar2;
  size_t __n;
  bool bVar3;
  PixelType PVar4;
  ulong __n_00;
  Array2D<void_*> *pAVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  int *piVar14;
  ChannelList *this;
  ChannelList *pCVar15;
  void *pvVar16;
  void *pvVar17;
  ostream *poVar18;
  long *plVar19;
  void **ppvVar20;
  int iVar21;
  int iVar22;
  undefined7 in_register_00000009;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar43;
  ulong local_348;
  void *local_340;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int local_2e8;
  long local_2d8;
  DeepScanLineInputFile file;
  string str;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  DeepSlice local_68 [56];
  
  iVar21 = (int)CONCAT71(in_register_00000009,randomChannels);
  if (iVar21 == 0) {
    pcVar28 = " reading all channels ";
    lVar25 = 0x16;
  }
  else {
    pcVar28 = " reading random channels ";
    lVar25 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar28,lVar25);
  std::ostream::flush();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  Imf_3_2::DeepScanLineInputFile::header();
  puVar10 = (undefined8 *)Imf_3_2::Header::displayWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar42 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar43 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar38._4_4_ = iVar42;
  auVar38._0_4_ = iVar42;
  auVar38._8_4_ = iVar43;
  auVar38._12_4_ = iVar43;
  iVar21 = movmskpd(iVar21,auVar38);
  if ((iVar21 != 3) ||
     (iVar42 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar43 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar39._4_4_ = iVar42, auVar39._0_4_ = iVar42, auVar39._8_4_ = iVar43, auVar39._12_4_ = iVar43
     , iVar42 = movmskpd((int)puVar11,auVar39), iVar42 != 3)) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x109,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::dataWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar42 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar43 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar40._4_4_ = iVar42;
  auVar40._0_4_ = iVar42;
  auVar40._8_4_ = iVar43;
  auVar40._12_4_ = iVar43;
  iVar21 = movmskpd(iVar21,auVar40);
  if ((iVar21 != 3) ||
     (iVar21 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar42 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar41._4_4_ = iVar21, auVar41._0_4_ = iVar21, auVar41._8_4_ = iVar42, auVar41._12_4_ = iVar42
     , iVar21 = movmskpd((int)puVar11,auVar41), iVar21 != 3)) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar37 = *pfVar12;
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar37 != *pfVar12) || (NAN(fVar37) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
  pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
  if ((((*pfVar12 != *pfVar13) || (NAN(*pfVar12) || NAN(*pfVar13))) || (pfVar12[1] != pfVar13[1]))
     || (NAN(pfVar12[1]) || NAN(pfVar13[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar37 = *pfVar12;
  pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar37 != *pfVar12) || (NAN(fVar37) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::lineOrder();
  iVar21 = *piVar14;
  piVar14 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar21 != *piVar14) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::compression();
  iVar21 = *piVar14;
  piVar14 = (int *)Imf_3_2::Header::compression();
  if (iVar21 != *piVar14) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this = (ChannelList *)Imf_3_2::Header::channels();
  pCVar15 = (ChannelList *)Imf_3_2::Header::channels();
  cVar6 = Imf_3_2::ChannelList::operator==(this,pCVar15);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  puVar11 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  __n = puVar10[1];
  if ((__n != puVar11[1]) ||
     ((__n != 0 && (iVar21 = bcmp((void *)*puVar10,(void *)*puVar11,__n), iVar21 != 0)))) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::dataWindow();
  iVar21 = piVar14[2];
  iVar42 = *piVar14;
  uVar23 = ((long)iVar21 - (long)iVar42) + 1;
  iVar43 = piVar14[3] - piVar14[1];
  uVar7 = iVar43 + 1;
  uVar35 = (long)(int)uVar7 * uVar23;
  pvVar16 = operator_new__(-(ulong)(uVar35 >> 0x3e != 0) | uVar35 * 4);
  uVar8 = random_int(3);
  uVar24 = (ulong)uVar8;
  uVar27 = uVar8 + channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)(int)uVar27);
  if (0 < (int)uVar27) {
    lVar25 = 0;
    do {
      pAVar5 = data._data;
      pvVar17 = operator_new__(-(ulong)(uVar35 >> 0x3d != 0) | uVar35 * 8);
      pvVar31 = *(void **)((long)&pAVar5->_data + lVar25);
      if (pvVar31 != (void *)0x0) {
        operator_delete__(pvVar31);
      }
      *(long *)((long)&pAVar5->_sizeX + lVar25) = (long)(int)uVar7;
      *(ulong *)((long)&pAVar5->_sizeY + lVar25) = uVar23;
      *(void **)((long)&pAVar5->_data + lVar25) = pvVar17;
      lVar25 = lVar25 + 0x18;
    } while ((ulong)uVar27 * 0x18 != lVar25);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  iVar22 = (int)uVar23;
  lVar25 = (long)iVar22;
  uVar35 = uVar23 * 4;
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((long)pvVar16 + piVar14[1] * lVar25 * -4 + (long)*piVar14 * -4),4,uVar35,1,1,
             0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  __n_00 = (ulong)(uint)channelCount;
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    lVar26 = 0x10;
    uVar33 = 0;
    iVar34 = 0;
    do {
      if (randomChannels) {
        iVar9 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] = iVar9;
        if (iVar9 == 1) goto LAB_00151b86;
      }
      else {
LAB_00151b86:
        PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar33 * 4);
        PVar4 = (uint)(PVar2 != UINT) * 3;
        if (PVar2 == HALF) {
          PVar4 = PVar2;
        }
        if (PVar2 == FLOAT) {
          PVar4 = PVar2;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1e0,(int)uVar33);
        std::__cxx11::stringbuf::str();
        iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
        uVar29 = (ulong)(iVar9 == 0) << 2;
        if (iVar9 == 1) {
          uVar29 = 2;
        }
        if (iVar9 == 2) {
          uVar29 = 4;
        }
        Imf_3_2::DeepSlice::DeepSlice
                  (local_68,PVar4,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar26) + (long)*piVar14 * -8 +
                           piVar14[1] * lVar25 * -8),8,(long)(iVar22 * 8),uVar29,1,1,0.0,false,false
                  );
        Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar34 = iVar34 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_170);
      }
      uVar33 = uVar33 + 1;
      lVar26 = lVar26 + 0x18;
    } while (__n_00 != uVar33);
    if (iVar34 != 0) {
      if (0 < (int)uVar8) {
        lVar26 = __n_00 * 0x18;
        uVar33 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar18 = (ostream *)std::ostream::operator<<(local_1e0,(int)uVar33);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_3_2::DeepSlice::DeepSlice
                    (local_68,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar26) + (long)*piVar14 * -8 +
                             piVar14[1] * lVar25 * -8),8,(long)(iVar22 * 8),4,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_170);
          uVar33 = uVar33 + 1;
          lVar26 = lVar26 + 0x18;
        } while (uVar24 != uVar33);
      }
      Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      local_2e8 = (int)((long)iVar21 - (long)iVar42);
      if (bulkRead) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
        std::ostream::flush();
        Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file,piVar14[1]);
        iVar21 = piVar14[1];
        iVar42 = piVar14[3];
        if (iVar21 <= iVar42) {
          lVar26 = (anonymous_namespace)::sampleCount._8_8_ * 4;
          lVar30 = 0;
          pvVar31 = pvVar16;
          lVar25 = 0;
          do {
            if (-1 < local_2e8) {
              uVar33 = 0;
              do {
                if (*(int *)((long)pvVar31 + uVar33 * 4) !=
                    *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar30 + uVar33 * 4)) {
                  __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                ,0x16f,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
                uVar33 = uVar33 + 1;
              } while ((uVar23 & 0xffffffff) != uVar33);
              if (-1 < local_2e8) {
                uVar33 = 0;
                do {
                  if (0 < channelCount) {
                    uVar27 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar25 * uVar23 * 4);
                    uVar29 = (ulong)uVar27 * 4;
                    lVar32 = 4;
                    uVar36 = 0;
                    do {
                      if ((uVar27 == 0) ||
                         ((randomChannels &&
                          (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar36] != 1)))) {
                        pvVar17 = (void *)0x0;
LAB_00151ff0:
                        *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar25 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) + uVar33 * 8)
                             = pvVar17;
                      }
                      else {
                        iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        if (iVar21 == 0) {
                          pvVar17 = operator_new__(uVar29);
                          *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar25 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                    uVar33 * 8) = pvVar17;
                          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        }
                        if (iVar21 == 1) {
                          pvVar17 = operator_new__((ulong)uVar27 * 2);
                          *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar25 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                    uVar33 * 8) = pvVar17;
                          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        }
                        if (iVar21 == 2) {
                          pvVar17 = operator_new__(uVar29);
                          goto LAB_00151ff0;
                        }
                      }
                      uVar36 = uVar36 + 1;
                      lVar32 = lVar32 + 6;
                    } while (__n_00 != uVar36);
                  }
                  if (0 < (int)uVar8) {
                    uVar27 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar25 * uVar23 * 4);
                    uVar29 = uVar24;
                    lVar32 = __n_00 * 0x18 + 0x10;
                    do {
                      pvVar17 = operator_new__((ulong)uVar27 << 2);
                      *(void **)(*(long *)((long)data._data + lVar32 + -8) * lVar25 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar32) + uVar33 * 8) =
                           pvVar17;
                      lVar32 = lVar32 + 0x18;
                      uVar29 = uVar29 - 1;
                    } while (uVar29 != 0);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != (uVar23 & 0xffffffff));
                iVar21 = piVar14[1];
                iVar42 = piVar14[3];
              }
            }
            lVar30 = lVar30 + lVar26;
            pvVar31 = (void *)((long)pvVar31 + uVar35);
            bVar3 = lVar25 < iVar42 - iVar21;
            lVar25 = lVar25 + 1;
          } while (bVar3);
        }
        Imf_3_2::DeepScanLineInputFile::readPixels((int)&file,iVar21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
        std::ostream::flush();
        if (piVar14[1] <= piVar14[3]) {
          local_2d8 = 0;
          lVar25 = 0;
          local_340 = pvVar16;
          do {
            Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file);
            if (-1 < local_2e8) {
              uVar33 = 0;
              do {
                if (*(int *)((long)local_340 + uVar33 * 4) !=
                    *(int *)((anonymous_namespace)::sampleCount._8_8_ * local_2d8 +
                             (anonymous_namespace)::sampleCount._16_8_ + uVar33 * 4)) {
                  __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                ,0x199,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
                uVar33 = uVar33 + 1;
              } while ((uVar23 & 0xffffffff) != uVar33);
              if (-1 < local_2e8) {
                uVar33 = 0;
                do {
                  if (0 < channelCount) {
                    uVar27 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar25 * uVar23 * 4);
                    uVar29 = (ulong)uVar27 * 4;
                    lVar26 = 4;
                    uVar36 = 0;
                    do {
                      if ((uVar27 == 0) ||
                         ((randomChannels &&
                          (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar36] != 1)))) {
                        pvVar31 = (void *)0x0;
LAB_00152304:
                        *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar25 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + uVar33 * 8)
                             = pvVar31;
                      }
                      else {
                        iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        if (iVar21 == 0) {
                          pvVar31 = operator_new__(uVar29);
                          *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar25 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) +
                                    uVar33 * 8) = pvVar31;
                          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        }
                        if (iVar21 == 1) {
                          pvVar31 = operator_new__((ulong)uVar27 * 2);
                          *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar25 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) +
                                    uVar33 * 8) = pvVar31;
                          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                        }
                        if (iVar21 == 2) {
                          pvVar31 = operator_new__(uVar29);
                          goto LAB_00152304;
                        }
                      }
                      uVar36 = uVar36 + 1;
                      lVar26 = lVar26 + 6;
                    } while (__n_00 != uVar36);
                  }
                  if (0 < (int)uVar8) {
                    uVar27 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar25 * uVar23 * 4);
                    lVar26 = __n_00 * 0x18 + 0x10;
                    uVar29 = uVar24;
                    do {
                      pvVar31 = operator_new__((ulong)uVar27 << 2);
                      *(void **)(*(long *)((long)data._data + lVar26 + -8) * lVar25 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar26) + uVar33 * 8) =
                           pvVar31;
                      lVar26 = lVar26 + 0x18;
                      uVar29 = uVar29 - 1;
                    } while (uVar29 != 0);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != (uVar23 & 0xffffffff));
              }
            }
            Imf_3_2::DeepScanLineInputFile::readPixels((int)&file);
            local_2d8 = local_2d8 + 4;
            local_340 = (void *)((long)local_340 + uVar35);
            bVar3 = lVar25 < (long)piVar14[3] - (long)piVar14[1];
            lVar25 = lVar25 + 1;
          } while (bVar3);
        }
      }
      if (-1 < iVar43) {
        uVar35 = 0;
        do {
          if (-1 < local_2e8) {
            iVar21 = (int)uVar35;
            uVar33 = 0;
            do {
              if (0 < channelCount) {
                iVar42 = (int)uVar33;
                uVar27 = (uint)(iVar21 * iVar22 + iVar42) % 0x801;
                fVar37 = (float)uVar27;
                local_348 = 0;
                do {
                  if (((!randomChannels) ||
                      (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[local_348] == 1)) &&
                     (*(int *)((anonymous_namespace)::sampleCount._8_8_ * uVar35 * 4 +
                               (anonymous_namespace)::sampleCount._16_8_ + uVar33 * 4) != 0)) {
                    uVar29 = 0;
                    do {
                      iVar34 = *(int *)((anonymous_namespace)::channelTypes + local_348 * 4);
                      if (iVar34 == 0) {
                        pvVar31 = data._data[local_348]._data
                                  [data._data[local_348]._sizeY * uVar35 + uVar33];
                        if (*(uint *)((long)pvVar31 + uVar29 * 4) != uVar27) {
                          poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar42);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar21);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18," error, should be ",0x12);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar27);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                          poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) +
                                          (char)poVar18);
                          std::ostream::put((char)poVar18);
                          std::ostream::flush();
                          std::ostream::flush();
                          if (*(uint *)((long)pvVar31 + uVar29 * 4) != uVar27) {
                            __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                          ,0x1d0,
                                          "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                         );
                          }
                        }
                        iVar34 = *(int *)((anonymous_namespace)::channelTypes + local_348 * 4);
                      }
                      if (iVar34 == 1) {
                        ppvVar20 = data._data[local_348]._data;
                        lVar25 = data._data[local_348]._sizeY * uVar35;
                        pvVar31 = ppvVar20[lVar25 + uVar33];
                        fVar1 = *(float *)(_imath_half_to_float_table +
                                          (ulong)*(ushort *)((long)pvVar31 + uVar29 * 2) * 4);
                        if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                          poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar42);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar21);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18," error, should be ",0x12);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar27);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                          plVar19 = (long *)::operator<<(poVar18,(half)*(uint16_t *)
                                                                        ((long)pvVar31 + uVar29 * 2)
                                                        );
                          std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
                          std::ostream::put((char)plVar19);
                          std::ostream::flush();
                          std::ostream::flush();
                          ppvVar20 = data._data[local_348]._data;
                          lVar25 = data._data[local_348]._sizeY * uVar35;
                        }
                        fVar1 = *(float *)(_imath_half_to_float_table +
                                          (ulong)*(ushort *)
                                                  ((long)ppvVar20[lVar25 + uVar33] + uVar29 * 2) * 4
                                          );
                        if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                          __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                        ,0x1dc,
                                        "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                       );
                        }
                        iVar34 = *(int *)((anonymous_namespace)::channelTypes + local_348 * 4);
                      }
                      if (iVar34 == 2) {
                        ppvVar20 = data._data[local_348]._data;
                        lVar25 = data._data[local_348]._sizeY * uVar35;
                        pvVar31 = ppvVar20[lVar25 + uVar33];
                        fVar1 = *(float *)((long)pvVar31 + uVar29 * 4);
                        if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                          poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar42);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar21);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18," error, should be ",0x12);
                          poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar27);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                          poVar18 = std::ostream::_M_insert<double>
                                              ((double)*(float *)((long)pvVar31 + uVar29 * 4));
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) +
                                          (char)poVar18);
                          std::ostream::put((char)poVar18);
                          std::ostream::flush();
                          std::ostream::flush();
                          ppvVar20 = data._data[local_348]._data;
                          lVar25 = data._data[local_348]._sizeY * uVar35;
                        }
                        fVar1 = *(float *)((long)ppvVar20[lVar25 + uVar33] + uVar29 * 4);
                        if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                          __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                        ,0x1e8,
                                        "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                       );
                        }
                      }
                      uVar29 = uVar29 + 1;
                    } while (uVar29 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * uVar35 *
                                                4 + (anonymous_namespace)::sampleCount._16_8_ +
                                               uVar33 * 4));
                  }
                  local_348 = local_348 + 1;
                } while (local_348 != __n_00);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != (uVar23 & 0xffffffff));
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar7);
        if (-1 < iVar43) {
          uVar35 = 0;
          do {
            if (-1 < local_2e8) {
              uVar33 = 0;
              do {
                if (0 < channelCount) {
                  lVar25 = 4;
                  uVar29 = 0;
                  do {
                    if ((!randomChannels) ||
                       (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar29] == 1)) {
                      iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar29 * 4);
                      if (iVar21 == 0) {
                        pvVar31 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) * uVar35
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar25 * 4) + uVar33 * 8);
                        if (pvVar31 == (void *)0x0) goto LAB_0015294d;
                        operator_delete__(pvVar31);
                        iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar29 * 4);
                      }
                      if (iVar21 == 1) {
                        pvVar31 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) * uVar35
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar25 * 4) + uVar33 * 8);
                        if (pvVar31 == (void *)0x0) goto LAB_0015294d;
                        operator_delete__(pvVar31);
                        iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar29 * 4);
                      }
                      if ((iVar21 == 2) &&
                         (pvVar31 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) *
                                               uVar35 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar25 * 4) +
                                              uVar33 * 8), pvVar31 != (void *)0x0)) {
                        operator_delete__(pvVar31);
                      }
                    }
LAB_0015294d:
                    uVar29 = uVar29 + 1;
                    lVar25 = lVar25 + 6;
                  } while (__n_00 != uVar29);
                }
                lVar25 = __n_00 * 0x18 + 0x10;
                uVar29 = uVar24;
                if (0 < (int)uVar8) {
                  do {
                    pvVar31 = *(void **)(*(long *)((long)data._data + lVar25 + -8) * uVar35 * 8 +
                                         *(long *)((long)&(data._data)->_sizeX + lVar25) +
                                        uVar33 * 8);
                    if (pvVar31 != (void *)0x0) {
                      operator_delete__(pvVar31);
                    }
                    lVar25 = lVar25 + 0x18;
                    uVar29 = uVar29 - 1;
                  } while (uVar29 != 0);
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 != (uVar23 & 0xffffffff));
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != uVar7);
        }
      }
      goto LAB_001520ed;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_001520ed:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar16);
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
  return;
}

Assistant:

void
readFile (
    const std::string& filename,
    int                channelCount,
    bool               bulkRead,
    bool               randomChannels)
{
    if (randomChannels) { cout << " reading random channels " << flush; }
    else
    {
        cout << " reading all channels " << flush;
    }

    DeepScanLineInputFile file (filename.c_str (), 8);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());

    const Box2i& dataWindow = fileHeader.dataWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&localSampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
        sizeof (unsigned int) * 1,       // xStride// 9
        sizeof (unsigned int) * width)); // yStride// 10

    vector<int> read_channel (channelCount);

    int channels_added = 0;

    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str, // name // 6
                DeepSlice (
                    type, // type // 7
                    (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
                    pointerSize * 1,     // xStride// 9
                    pointerSize * width, // yStride// 10
                    sampleSize));        // sampleStride
            channels_added++;
        }
    }

    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }
        }

        file.readPixels (dataWindow.min.y, dataWindow.max.y);
    }

    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts (y);

            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }

            file.readPixels (y);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value =
                                (unsigned int*) (data[k][i][j]);
                            if (value[l] !=
                                static_cast<unsigned int> (i * width + j) %
                                    2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                value[l] ==
                                static_cast<unsigned int> (i * width + j) %
                                    2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((half*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((float*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    if (channelTypes[k] == 0)
                        delete[](unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                    if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
                }
            }
            for (int f = 0; f < fillChannels; ++f)
            {
                delete[](float*) data[f + channelCount][i][j];
            }
        }
}